

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::setWidget(QMdiSubWindow *this,QWidget *widget)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  QMdiSubWindowPrivate *pQVar5;
  QMdiSubWindowPrivate *this_00;
  QObject *pQVar6;
  QWidget *pQVar7;
  QString *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  bool isWindowModified;
  QSizeGrip *sizeGrip;
  QLayout *layout;
  bool wasResized;
  QMdiSubWindowPrivate *d;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  byte bVar9;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff0f;
  QLayout *in_stack_ffffffffffffff10;
  WidgetAttribute WVar11;
  QString *this_01;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff28;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff30;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffff3c;
  uint uVar12;
  QIcon local_98;
  undefined1 in_stack_ffffffffffffff73;
  WidgetAttribute in_stack_ffffffffffffff74;
  QIcon in_stack_ffffffffffffff78;
  int local_34;
  char local_30 [32];
  QString *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  pQVar5 = d_func((QMdiSubWindow *)0x633148);
  if (local_10 == (QString *)0x0) {
    QMdiSubWindowPrivate::removeBaseWidget(in_stack_ffffffffffffff30);
  }
  else {
    bVar1 = ::operator==((QWidget **)in_stack_ffffffffffffff10,
                         (QPointer<QWidget> *)
                         CONCAT17(in_stack_ffffffffffffff0f,
                                  CONCAT16(in_stack_ffffffffffffff0e,
                                           CONCAT15(in_stack_ffffffffffffff0d,
                                                    CONCAT14(in_stack_ffffffffffffff0c,
                                                             in_stack_ffffffffffffff08)))));
    WVar11 = (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 (char *)in_RDI,WVar11,
                 (char *)CONCAT17(in_stack_ffffffffffffff0f,
                                  CONCAT16(in_stack_ffffffffffffff0e,
                                           CONCAT15(in_stack_ffffffffffffff0d,
                                                    CONCAT14(in_stack_ffffffffffffff0c,
                                                             in_stack_ffffffffffffff08)))));
      QMessageLogger::warning(local_30,"QMdiSubWindow::setWidget: widget is already set");
    }
    else {
      bVar1 = QWidget::testAttribute(in_RDI,WVar11);
      QMdiSubWindowPrivate::removeBaseWidget(in_stack_ffffffffffffff30);
      this_00 = (QMdiSubWindowPrivate *)QWidget::layout((QWidget *)0x6331e4);
      if (this_00 == (QMdiSubWindowPrivate *)0x0) {
        QWidget::setParent((QWidget *)in_stack_ffffffffffffff30,(QWidget *)in_stack_ffffffffffffff28
                          );
      }
      else {
        QLayout::addWidget(in_stack_ffffffffffffff10,
                           (QWidget *)
                           CONCAT17(in_stack_ffffffffffffff0f,
                                    CONCAT16(in_stack_ffffffffffffff0e,
                                             CONCAT15(in_stack_ffffffffffffff0d,
                                                      CONCAT14(in_stack_ffffffffffffff0c,
                                                               in_stack_ffffffffffffff08)))));
      }
      QFlags<Qt::FindChildOption>::QFlags
                ((QFlags<Qt::FindChildOption> *)local_10,
                 CONCAT13(in_stack_ffffffffffffff0f,
                          CONCAT12(in_stack_ffffffffffffff0e,
                                   CONCAT11(in_stack_ffffffffffffff0d,in_stack_ffffffffffffff0c))));
      pQVar6 = (QObject *)
               QObject::findChild<QSizeGrip*>
                         (&in_RDI->super_QObject,(FindChildOptions)in_stack_ffffffffffffff3c.i);
      this_01 = local_10;
      if (pQVar6 != (QObject *)0x0) {
        local_34 = (int)in_RDI;
        QObject::installEventFilter(pQVar6);
        this_01 = local_10;
      }
      uVar10 = (undefined1)((ulong)pQVar6 >> 0x38);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QSizeGrip> *)0x633274);
      if (bVar2) {
        pQVar7 = &QPointer<QSizeGrip>::operator->((QPointer<QSizeGrip> *)0x63328b)->super_QWidget;
        QWidget::raise(pQVar7,local_34);
      }
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)this_01,
                 (QWidget *)
                 CONCAT17(in_stack_ffffffffffffff0f,
                          CONCAT16(in_stack_ffffffffffffff0e,
                                   CONCAT15(in_stack_ffffffffffffff0d,
                                            CONCAT14(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08)))));
      pQVar7 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6332bd);
      QObject::installEventFilter(&pQVar7->super_QObject);
      pQVar5->ignoreWindowTitleChange = true;
      bVar2 = QWidget::isWindowModified((QWidget *)0x6332e0);
      uVar4 = (uint)bVar2 << 0x18;
      QWidget::windowTitle(in_RDI);
      bVar3 = QString::isEmpty((QString *)0x633305);
      QString::~QString((QString *)0x633316);
      if ((bVar3 & 1) != 0) {
        QMdiSubWindowPrivate::updateWindowTitle(this_00,(bool)uVar10);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x633340);
        bVar2 = QWidget::isWindowModified((QWidget *)0x633348);
        uVar4 = (uint)bVar2 << 0x18;
      }
      bVar2 = QWidget::isWindowModified((QWidget *)0x633358);
      uVar12 = 0;
      bVar9 = false;
      if ((!bVar2) && (bVar9 = false, (uVar4 & 0x1000000) != 0)) {
        QWidget::windowTitle(in_RDI);
        uVar12 = 0x10000;
        QVar8 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this_01);
        in_stack_ffffffffffffff28 = (QMdiSubWindowPrivate *)QVar8.m_size;
        QVar8.m_size._7_1_ = in_stack_ffffffffffffff27;
        QVar8.m_size._0_7_ = in_stack_ffffffffffffff20;
        QVar8.m_data = (char *)in_stack_ffffffffffffff28;
        bVar9 = QString::contains((QString *)
                                  CONCAT17(bVar3,CONCAT16(bVar9,CONCAT15(in_stack_ffffffffffffff0d,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08)))),QVar8,
                                  CaseInsensitive);
      }
      uVar10 = bVar9;
      if ((uVar12 & 0x10000) != 0) {
        QString::~QString((QString *)0x6333e7);
      }
      if ((bVar9 & 1) != 0) {
        QWidget::setWindowModified
                  ((QWidget *)in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27);
      }
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x633415);
      QWidget::windowTitle(in_RDI);
      QString::operator=(this_01,(QString *)
                                 CONCAT17(bVar3,CONCAT16(uVar10,CONCAT15(bVar9,CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08)))));
      WVar11 = (WidgetAttribute)((ulong)this_01 >> 0x20);
      QString::~QString((QString *)0x633442);
      pQVar5->ignoreWindowTitleChange = false;
      QWidget::windowIcon((QWidget *)in_stack_ffffffffffffff28);
      uVar4 = QIcon::isNull();
      bVar9 = 0;
      bVar3 = 0;
      if ((uVar4 & 1) != 0) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x63348c);
        QWidget::windowIcon((QWidget *)in_stack_ffffffffffffff28);
        bVar9 = 1;
        bVar3 = QIcon::isNull();
        bVar3 = bVar3 ^ 0xff;
      }
      uVar4 = (uint)bVar3 << 0x18;
      if ((bVar9 & 1) != 0) {
        QIcon::~QIcon((QIcon *)&stack0xffffffffffffff70);
      }
      QIcon::~QIcon((QIcon *)&stack0xffffffffffffff78);
      if ((uVar4 & 0x1000000) != 0) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6334ee);
        QWidget::windowIcon((QWidget *)in_stack_ffffffffffffff28);
        QWidget::setWindowIcon((QWidget *)CONCAT17(bVar9,in_stack_ffffffffffffff20),(QIcon *)in_RDI)
        ;
        QIcon::~QIcon(&local_98);
      }
      QMdiSubWindowPrivate::updateGeometryConstraints(in_stack_ffffffffffffff28);
      if ((!bVar1) && (bVar1 = QWidget::testAttribute(in_RDI,WVar11), bVar1)) {
        QWidget::setAttribute
                  ((QWidget *)in_stack_ffffffffffffff78.d,in_stack_ffffffffffffff74,
                   (bool)in_stack_ffffffffffffff73);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::setWidget(QWidget *widget)
{
    Q_D(QMdiSubWindow);
    if (!widget) {
        d->removeBaseWidget();
        return;
    }

    if (Q_UNLIKELY(widget == d->baseWidget)) {
        qWarning("QMdiSubWindow::setWidget: widget is already set");
        return;
    }

    bool wasResized = testAttribute(Qt::WA_Resized);
    d->removeBaseWidget();

    if (QLayout *layout = this->layout())
        layout->addWidget(widget);
    else
        widget->setParent(this);

#if QT_CONFIG(sizegrip)
    QSizeGrip *sizeGrip = widget->findChild<QSizeGrip *>();
    if (sizeGrip)
        sizeGrip->installEventFilter(this);
    if (d->sizeGrip)
        d->sizeGrip->raise();
#endif

    d->baseWidget = widget;
    d->baseWidget->installEventFilter(this);

    d->ignoreWindowTitleChange = true;
    bool isWindowModified = this->isWindowModified();
    if (windowTitle().isEmpty()) {
        d->updateWindowTitle(true);
        isWindowModified = d->baseWidget->isWindowModified();
    }
    if (!this->isWindowModified() && isWindowModified && windowTitle().contains("[*]"_L1))
        setWindowModified(isWindowModified);
    d->lastChildWindowTitle = d->baseWidget->windowTitle();
    d->ignoreWindowTitleChange = false;

    if (windowIcon().isNull() && !d->baseWidget->windowIcon().isNull())
        setWindowIcon(d->baseWidget->windowIcon());

    d->updateGeometryConstraints();
    if (!wasResized && testAttribute(Qt::WA_Resized))
        setAttribute(Qt::WA_Resized, false);
}